

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

bool __thiscall sc_core::sc_trace_file_base::initialize(sc_trace_file_base *this)

{
  char *pcVar1;
  value_type vVar2;
  value_type vVar3;
  ostream *poVar4;
  long *in_RDI;
  stringstream ss;
  sc_time_tuple kernel_res_tuple;
  bool running_regression;
  sc_time *in_stack_fffffffffffffdd8;
  sc_trace_file_base *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  string local_1f0 [56];
  stringstream local_1b8 [12];
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  sc_severity in_stack_fffffffffffffe74;
  sc_time_tuple local_28;
  undefined1 local_11;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x17) = 1;
    if ((tracing_initialized_ & 1) == 0) {
      tracing_initialized_ = 1;
      pcVar1 = getenv("SYSTEMC_REGRESSION");
      local_11 = pcVar1 != (char *)0x0;
      if ((bool)local_11) {
        sc_report_handler::set_actions
                  (in_stack_fffffffffffffdf0,(sc_severity)((ulong)in_stack_fffffffffffffde8 >> 0x20)
                   ,(sc_actions)in_stack_fffffffffffffde8);
      }
    }
    if (in_RDI[0xf] == 0) {
      open_fp(in_stack_fffffffffffffde0);
    }
    sc_get_time_resolution();
    sc_time_tuple::sc_time_tuple
              ((sc_time_tuple *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    vVar2 = sc_time_tuple::value((sc_time_tuple *)in_stack_fffffffffffffde0);
    sc_time_tuple::unit(&local_28);
    vVar3 = unit_to_fs((sc_time_unit)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    in_RDI[0x11] = vVar2 * vVar3;
    if ((*(byte *)(in_RDI + 0x12) & 1) == 0) {
      in_RDI[0x10] = in_RDI[0x11];
      std::__cxx11::stringstream::stringstream(local_1b8);
      sc_get_time_resolution();
      poVar4 = sc_core::operator<<((ostream *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      poVar4 = std::operator<<(poVar4," (");
      poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x13));
      std::operator<<(poVar4,")");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      sc_report_handler::report
                (in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
    (**(code **)(*in_RDI + 0x118))();
    local_1 = (bool)(*(byte *)(in_RDI + 0x17) & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
sc_trace_file_base::initialize()
{
    if( initialized_ )
      return false;

    initialized_ = true;

    if( !tracing_initialized_ ) {
        tracing_initialized_ = true;
        bool running_regression = ( getenv( "SYSTEMC_REGRESSION" ) != NULL );

        // hide some messages during regression
        if( running_regression ) {
          sc_report_handler::set_actions( SC_ID_TRACING_TIMESCALE_DEFAULT_
                                        , SC_INFO,    SC_DO_NOTHING );
        }
    }

    // open trace file
    if(!fp) open_fp();

    sc_time_tuple kernel_res_tuple = sc_time_tuple(sc_get_time_resolution());
    kernel_unit_fs = kernel_res_tuple.value() * unit_to_fs(kernel_res_tuple.unit());

    // setup timescale
    if( !timescale_set_by_user )
    {
        trace_unit_fs = kernel_unit_fs;

        std::stringstream ss;
        ss << sc_get_time_resolution() << " (" << filename_ << ")";
        SC_REPORT_INFO( SC_ID_TRACING_TIMESCALE_DEFAULT_
                      , ss.str().c_str() );
    }

    // initialize derived tracing implementation class (VCD/WIF)
    do_initialize();

    return initialized_;
}